

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_lightning_bolt(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  CHAR_DATA *in_RCX;
  undefined8 in_RDX;
  undefined4 in_EDI;
  undefined4 in_R8D;
  float fVar4;
  undefined4 unaff_retaddr;
  int unaff_retaddr_00;
  CHAR_DATA *in_stack_00000008;
  float dam;
  CHAR_DATA *victim;
  undefined4 in_stack_ffffffffffffffc8;
  int to;
  int from;
  undefined4 in_stack_ffffffffffffffe0;
  CHAR_DATA *pCVar5;
  int iVar6;
  
  from = 0x32;
  pCVar5 = in_RCX;
  std::min<int>((int *)&stack0xfffffffffffffff8,(int *)&stack0xffffffffffffffd0);
  to = 0;
  piVar3 = std::max<int>((int *)&stack0xffffffffffffffcc,(int *)&stack0xfffffffffffffff8);
  iVar6 = *piVar3;
  iVar2 = number_range(from,to);
  fVar4 = (float)iVar2;
  char_data::Class((char_data *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0));
  bVar1 = RString::operator==((RString *)CONCAT44(fVar4,from),
                              (char *)CONCAT44(to,in_stack_ffffffffffffffc8));
  if (bVar1) {
    act((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX,(void *)CONCAT44(fVar4,from),
        (void *)CONCAT44(to,in_stack_ffffffffffffffc8),0);
    act((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX,(void *)CONCAT44(fVar4,from),
        (void *)CONCAT44(to,in_stack_ffffffffffffffc8),0);
    act((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX,(void *)CONCAT44(fVar4,from),
        (void *)CONCAT44(to,in_stack_ffffffffffffffc8),0);
  }
  saves_spell((int)victim,in_stack_00000008,unaff_retaddr_00);
  damage_old((CHAR_DATA *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
             (CHAR_DATA *)CONCAT44(in_EDI,iVar6),(int)((ulong)in_RDX >> 0x20),(int)in_RDX,
             (int)((ulong)pCVar5 >> 0x20),SUB81((ulong)pCVar5 >> 0x18,0));
  return;
}

Assistant:

void spell_lightning_bolt(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	static const short dam_each[] =
	{
		0,  0,  0,  0,  0,  0,  0,  0,  0,  25, 28, 31, 34, 37, 40, 40, 41,
		42, 42, 43, 44, 44, 45, 46, 46, 47, 48, 48, 49, 50, 50, 51, 52, 52,
		53, 54, 54, 55, 56, 56, 57, 58, 58, 59, 60, 60, 61, 62, 62, 63, 64
	}
	;
	float dam;

	level = std::min(level, (int)sizeof(dam_each) / (int)sizeof(dam_each[0]) - 1);
	level = std::max(0, level);
	dam = number_range(dam_each[level] / 2, dam_each[level] * 2);

	if (ch->Class()->name == "sorcerer")
	{
		act("You extend an arm towards $N and raw lightning leaps from your fingertips!", ch, nullptr, victim, TO_CHAR);
		act("$n extends an arm towards you and raw lightning leaps from $s fingertips!", ch, nullptr, victim, TO_VICT);
		act("$n extends an arm towards $N and raw lightning leaps from $s fingertips!", ch, nullptr, victim, TO_NOTVICT);
		dam *= 1.5;
	}

	if (saves_spell(level, victim, DAM_LIGHTNING))
		dam /= 2;

	damage_old(ch, victim, (int)dam, sn, DAM_LIGHTNING, true);
}